

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# network.cpp
# Opt level: O0

void featurePad(pBox *pbox,pBox *outpBox,int pad,int padw,int padh)

{
  int local_40;
  int local_3c;
  int row_1;
  int row;
  mydataFmt *pIn;
  mydataFmt *p;
  int padh_local;
  int padw_local;
  int pad_local;
  pBox *outpBox_local;
  pBox *pbox_local;
  
  pIn = outpBox->pdata;
  _row_1 = pbox->pdata;
  if (pad == -1) {
    for (local_3c = 0; local_3c < outpBox->channel * outpBox->height; local_3c = local_3c + 1) {
      if ((local_3c % outpBox->height < padh) ||
         ((outpBox->height - padh) + -1 < local_3c % outpBox->height)) {
        pIn = pIn + outpBox->width;
      }
      else {
        memcpy(pIn + padw,_row_1,(long)pbox->width << 2);
        pIn = pIn + padw + (pbox->width + padw);
        _row_1 = _row_1 + pbox->width;
      }
    }
  }
  else {
    for (local_40 = 0; local_40 < outpBox->channel * outpBox->height; local_40 = local_40 + 1) {
      if ((local_40 % outpBox->height < pad) ||
         ((outpBox->height - pad) + -1 < local_40 % outpBox->height)) {
        pIn = pIn + outpBox->width;
      }
      else {
        memcpy(pIn + pad,_row_1,(long)pbox->width << 2);
        pIn = pIn + pad + (pbox->width + pad);
        _row_1 = _row_1 + pbox->width;
      }
    }
  }
  return;
}

Assistant:

void featurePad(const pBox *pbox, pBox *outpBox, const int pad, const int padw, const int padh) {
    mydataFmt *p = outpBox->pdata;
    mydataFmt *pIn = pbox->pdata;
    if (pad == -1) {
        for (int row = 0; row < outpBox->channel * outpBox->height; row++) {
            if ((row % outpBox->height) < padh || (row % outpBox->height > (outpBox->height - padh - 1))) {
                p += outpBox->width;
                continue;
            }
            p += padw;
            memcpy(p, pIn, pbox->width * sizeof(mydataFmt));
            p += pbox->width + padw;
            pIn += pbox->width;
        }
    } else {
        for (int row = 0; row < outpBox->channel * outpBox->height; row++) {
            if ((row % outpBox->height) < pad || (row % outpBox->height > (outpBox->height - pad - 1))) {
                p += outpBox->width;
                continue;
            }
            p += pad;
            memcpy(p, pIn, pbox->width * sizeof(mydataFmt));
            p += pbox->width + pad;
            pIn += pbox->width;
        }
    }
}